

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileinfo.cpp
# Opt level: O0

void __thiscall QFileInfo::setFile(QFileInfo *this,QDir *dir,QString *path)

{
  QString *in_RDI;
  long in_FS_OFFSET;
  QDir *unaff_retaddr;
  QFileInfo *this_00;
  QFileInfo local_20 [3];
  QString *fileName;
  
  fileName = *(QString **)(in_FS_OFFSET + 0x28);
  this_00 = local_20;
  QDir::filePath(unaff_retaddr,fileName);
  setFile(this_00,in_RDI);
  QString::~QString((QString *)0x2ab483);
  if (*(QString **)(in_FS_OFFSET + 0x28) == fileName) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileInfo::setFile(const QDir &dir, const QString &path)
{
    setFile(dir.filePath(path));
}